

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O1

cfg_entry * cfg_db_find_entry(cfg_db *db,char *section_type,char *section_name,char *entry_name)

{
  avl_node *paVar1;
  cfg_entry *pcVar2;
  
  paVar1 = avl_find(&db->sectiontypes,section_type);
  if (paVar1 == (avl_node *)0x0) {
    paVar1 = (avl_node *)0x0;
  }
  else {
    paVar1 = avl_find((avl_tree *)&paVar1[1].parent,section_name);
  }
  if (paVar1 != (avl_node *)0x0) {
    pcVar2 = (cfg_entry *)avl_find((avl_tree *)&paVar1[1].parent,entry_name);
    return pcVar2;
  }
  return (cfg_entry *)0x0;
}

Assistant:

struct cfg_entry *
cfg_db_find_entry(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name) {
  struct cfg_named_section *named;
  struct cfg_entry *entry = NULL;

  /* get named section */
  named = cfg_db_find_namedsection(db, section_type, section_name);
  if (named != NULL) {
    entry = avl_find_element(&named->entries, entry_name, entry, node);
  }
  return entry;
}